

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::Optimize(GlobOpt *this)

{
  ArgSlot *pAVar1;
  BVSparseNode **ppBVar2;
  Func *pFVar3;
  PageAllocator *pageAllocator;
  bool bVar4;
  ArgSlot AVar5;
  SymID SVar6;
  JITTimeFunctionBody *this_00;
  BVSparse<Memory::JitArenaAllocator> **ppBVar7;
  undefined1 local_138 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  NoRecoverMemoryJitArenaAllocator localTempAlloc;
  
  this->objectTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  AVar5 = Func::GetInParamsCount(this->func);
  pFVar3 = this->func;
  pFVar3->argInsCount = AVar5;
  this_00 = Func::GetJITFunctionBody(pFVar3);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  pFVar3 = this->func;
  if (!bVar4) {
    pAVar1 = &pFVar3->argInsCount;
    *pAVar1 = *pAVar1 - 1;
  }
  bVar4 = Func::DoGlobOpt(pFVar3);
  if (bVar4) {
    ppBVar2 = &localAlloc.super_JitArenaAllocator.bvFreeList;
    localAlloc.super_JitArenaAllocator.bvFreeList._0_4_ = 0xd1;
    local_138 = (undefined1  [8])0x0;
    ppBVar7 = JsUtil::
              BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::LookupWithKey<int>
                        (this->func->m_symTable->m_propertyEquivBvMap,(int *)ppBVar2,
                         (BVSparse<Memory::JitArenaAllocator> **)local_138);
    this->lengthEquivBv = *ppBVar7;
    localAlloc.super_JitArenaAllocator.bvFreeList._0_4_ = 0x1cf;
    local_138 = (undefined1  [8])0x0;
    ppBVar7 = JsUtil::
              BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::LookupWithKey<int>
                        (this->func->m_symTable->m_propertyEquivBvMap,(int *)ppBVar2,
                         (BVSparse<Memory::JitArenaAllocator> **)local_138);
    this->argumentsEquivBv = *ppBVar7;
    localAlloc.super_JitArenaAllocator.bvFreeList._0_4_ = 0x1cd;
    local_138 = (undefined1  [8])0x0;
    ppBVar7 = JsUtil::
              BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::LookupWithKey<int>
                        (this->func->m_symTable->m_propertyEquivBvMap,
                         (int *)&localAlloc.super_JitArenaAllocator.bvFreeList,
                         (BVSparse<Memory::JitArenaAllocator> **)local_138);
    this->callerEquivBv = *ppBVar7;
    pageAllocator =
         (this->func->m_alloc->super_ArenaAllocator).
         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
         pageAllocator;
    Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_138,L"BE-GlobOpt",pageAllocator,
               Js::Throw::OutOfMemory);
    this->alloc = (JitArenaAllocator *)local_138;
    ppBVar2 = &localAlloc.super_JitArenaAllocator.bvFreeList;
    Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)ppBVar2,L"BE-GlobOpt temp",pageAllocator,
               Js::Throw::OutOfMemory);
    this->tempAlloc = (JitArenaAllocator *)ppBVar2;
    SVar6 = SymTable::GetMaxSymID(this->func->m_symTable);
    this->maxInitialSymID = SVar6;
    BackwardPass(this,CaptureByteCodeRegUsePhase);
    BackwardPass(this,BackwardPhase);
    ForwardPass(this);
    BackwardPass(this,DeadStorePhase);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               &localAlloc.super_JitArenaAllocator.bvFreeList);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138);
    TailDupPass(this);
    return;
  }
  this->lengthEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->argumentsEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->callerEquivBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  BackwardPass(this,DeadStorePhase);
  CannotAllocateArgumentsObjectOnStack(this,(Func *)0x0);
  return;
}

Assistant:

void
GlobOpt::Optimize()
{
    this->objectTypeSyms = nullptr;

    this->func->argInsCount = this->func->GetInParamsCount();
    if (!func->GetJITFunctionBody()->IsAsmJsMode())
    {
        // Don't include "this" pointer in the count when not in AsmJs mode (AsmJS does not have "this").
        this->func->argInsCount--;
    }

    if (!func->DoGlobOpt())
    {
        this->lengthEquivBv = nullptr;
        this->argumentsEquivBv = nullptr;
        this->callerEquivBv = nullptr;

        // Still need to run the dead store phase to calculate the live reg on back edge
        this->BackwardPass(Js::DeadStorePhase);
        CannotAllocateArgumentsObjectOnStack(nullptr);
        return;
    }

    {
        this->lengthEquivBv = this->func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::length, nullptr); // Used to kill live "length" properties
        this->argumentsEquivBv = func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::arguments, nullptr); // Used to kill live "arguments" properties
        this->callerEquivBv = func->m_symTable->m_propertyEquivBvMap->Lookup(Js::PropertyIds::caller, nullptr); // Used to kill live "caller" properties

        // The backward phase needs the glob opt's allocator to allocate the propertyTypeValueMap
        // in GlobOpt::EnsurePropertyTypeValue and ranges of instructions where int overflow may be ignored.
        // (see BackwardPass::TrackIntUsage)
        PageAllocator * pageAllocator = this->func->m_alloc->GetPageAllocator();
        NoRecoverMemoryJitArenaAllocator localAlloc(_u("BE-GlobOpt"), pageAllocator, Js::Throw::OutOfMemory);
        this->alloc = &localAlloc;

        NoRecoverMemoryJitArenaAllocator localTempAlloc(_u("BE-GlobOpt temp"), pageAllocator, Js::Throw::OutOfMemory);
        this->tempAlloc = &localTempAlloc;

        // The forward passes use info (upwardExposedUses) from the backward pass. This info
        // isn't available for some of the symbols created during the backward pass, or the forward pass.
        // Keep track of the last symbol for which we're guaranteed to have data.
        this->maxInitialSymID = this->func->m_symTable->GetMaxSymID();
#if DBG
        this->BackwardPass(Js::CaptureByteCodeRegUsePhase);
#endif
        this->BackwardPass(Js::BackwardPhase);
        this->ForwardPass();
        this->BackwardPass(Js::DeadStorePhase);
    }
    this->TailDupPass();
}